

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

Int128 __thiscall ClipperLib::Int128::operator/(Int128 *this,Int128 *rhs)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *in_RDX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  Int128 IVar13;
  
  uVar7 = *in_RDX;
  uVar6 = in_RDX[1];
  if (uVar6 != 0 || uVar7 != 0) {
    uVar5 = rhs->hi;
    uVar2 = rhs->lo;
    uVar4 = uVar5;
    if ((long)uVar5 < 0) {
      bVar12 = uVar2 == 0;
      uVar2 = -uVar2;
      uVar4 = ~uVar5;
      if (bVar12) {
        uVar4 = -uVar5;
      }
    }
    uVar9 = ~uVar7;
    if (uVar6 == 0) {
      uVar9 = -uVar7;
    }
    uVar1 = -uVar6;
    if (-1 < (long)uVar7) {
      uVar9 = uVar7;
      uVar1 = uVar6;
    }
    bVar12 = (long)uVar4 < (long)uVar9;
    if (uVar9 == uVar4) {
      bVar12 = (long)uVar2 < (long)uVar1;
    }
    if (bVar12) {
      this->hi = 0;
      this->lo = 0;
    }
    else {
      uVar5 = uVar5 ^ uVar7;
      uVar7 = ~uVar9;
      if (uVar1 == 0) {
        uVar7 = -uVar9;
      }
      iVar8 = 0x80;
      uVar9 = 0;
      uVar6 = 0;
      do {
        uVar9 = uVar9 << 1 | uVar6 >> 0x3f;
        uVar6 = uVar6 << 1 | uVar4 >> 0x3f;
        uVar4 = uVar4 << 1 | uVar2 >> 0x3f;
        uVar10 = uVar6 - uVar1;
        uVar11 = uVar9 + uVar7 + (ulong)(uVar10 < -uVar1);
        if (-1 < (long)uVar11) {
          uVar9 = uVar11;
          uVar6 = uVar10;
        }
        uVar2 = (ulong)(-1 < (long)uVar11) + uVar2 * 2;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      if ((long)uVar5 < 0) {
        if (uVar2 == 0) {
          uVar4 = -uVar4;
        }
        else {
          uVar2 = -uVar2;
          uVar4 = ~uVar4;
        }
      }
      this->hi = uVar4;
      this->lo = uVar2;
    }
    IVar13.lo = uVar5;
    IVar13.hi = (long64)this;
    return IVar13;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Int128 operator/: divide by zero";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

Int128 operator/ (const Int128 &rhs) const
    {
      if (rhs.lo == 0 && rhs.hi == 0)
        throw "Int128 operator/: divide by zero";
      bool negate = (rhs.hi < 0) != (hi < 0);
      Int128 result(*this), denom(rhs);
      if (result.hi < 0) Negate(result);
      if (denom.hi < 0)  Negate(denom);
      if (denom > result) return Int128(0); //result is only a fraction of 1
      Negate(denom);

      Int128 p(0);
      for (int i = 0; i < 128; ++i)
      {
        p.hi = p.hi << 1;
        if (p.lo < 0) p.hi++;
        p.lo = long64(p.lo) << 1;
        if (result.hi < 0) p.lo++;
        result.hi = result.hi << 1;
        if (result.lo < 0) result.hi++;
        result.lo = long64(result.lo) << 1;
        Int128 p2(p);
        p += denom;
        if (p.hi < 0) p = p2;
        else result.lo++;
      }
      if (negate) Negate(result);
      return result;
    }